

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void SetRPCWarmupFinished(void)

{
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock7;
  unique_lock<std::mutex> uStack_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<GlobalMutex>::UniqueLock
            ((UniqueLock<GlobalMutex> *)&uStack_18,&g_rpc_warmup_mutex,"g_rpc_warmup_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp"
             ,0x159,false);
  if (fRPCInWarmup == '\x01') {
    __assert_fail("fRPCInWarmup",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp"
                  ,0x15a,"void SetRPCWarmupFinished()");
  }
  fRPCInWarmup = 1;
  std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetRPCWarmupFinished()
{
    LOCK(g_rpc_warmup_mutex);
    assert(fRPCInWarmup);
    fRPCInWarmup = false;
}